

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

void ncnn_mat_destroy(ncnn_mat_t mat)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    if (in_RDI[1] != 0) {
      piVar2 = (int *)in_RDI[1];
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (in_RDI[4] == 0) {
          if ((void *)*in_RDI != (void *)0x0) {
            free((void *)*in_RDI);
          }
        }
        else {
          (**(code **)(*(long *)in_RDI[4] + 0x18))((long *)in_RDI[4],*in_RDI);
        }
      }
    }
    *in_RDI = 0;
    in_RDI[2] = 0;
    *(undefined4 *)(in_RDI + 3) = 0;
    *(undefined4 *)(in_RDI + 5) = 0;
    *(undefined4 *)((long)in_RDI + 0x2c) = 0;
    *(undefined4 *)(in_RDI + 6) = 0;
    *(undefined4 *)((long)in_RDI + 0x34) = 0;
    *(undefined4 *)(in_RDI + 7) = 0;
    in_RDI[8] = 0;
    in_RDI[1] = 0;
    operator_delete(in_RDI,0x48);
  }
  return;
}

Assistant:

void ncnn_mat_destroy(ncnn_mat_t mat)
{
    delete (Mat*)mat;
}